

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.cpp
# Opt level: O0

void __thiscall SQClass::Finalize(SQClass *this)

{
  SQUnsignedInteger SVar1;
  SQClassMember *fill;
  long in_RDI;
  SQInteger _n__1;
  SQInteger _n_;
  SQClassMember *in_stack_ffffffffffffff90;
  undefined8 *newsize;
  SQClassMember *this_00;
  long local_50;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  SQClassMember *local_10;
  
  ::SQObjectPtr::Null(&in_stack_ffffffffffffff90->val);
  local_10 = (SQClassMember *)0x0;
  while (this_00 = local_10,
        SVar1 = sqvector<SQClassMember>::size((sqvector<SQClassMember> *)(in_RDI + 0x40)),
        (long)this_00 < (long)SVar1) {
    sqvector<SQClassMember>::operator[]
              ((sqvector<SQClassMember> *)(in_RDI + 0x40),(SQUnsignedInteger)local_10);
    SQClassMember::Null(in_stack_ffffffffffffff90);
    local_10 = (SQClassMember *)((long)&(local_10->val).super_SQObject._type + 1);
  }
  fill = (SQClassMember *)(in_RDI + 0x58);
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  newsize = &local_38;
  SQClassMember::SQClassMember(this_00);
  sqvector<SQClassMember>::resize
            ((sqvector<SQClassMember> *)this_00,(SQUnsignedInteger)newsize,fill);
  SQClassMember::~SQClassMember(fill);
  for (local_50 = 0; local_50 < 0x12; local_50 = local_50 + 1) {
    ::SQObjectPtr::Null(&fill->val);
  }
  if (*(long *)(in_RDI + 0x30) != 0) {
    *(long *)(*(long *)(in_RDI + 0x30) + 8) = *(long *)(*(long *)(in_RDI + 0x30) + 8) + -1;
    if (*(long *)(*(long *)(in_RDI + 0x30) + 8) == 0) {
      (**(code **)(**(long **)(in_RDI + 0x30) + 0x10))();
    }
    *(undefined8 *)(in_RDI + 0x30) = 0;
  }
  if ((*(long *)(in_RDI + 0x38) != 0) && (*(long *)(in_RDI + 0x38) != 0)) {
    *(long *)(*(long *)(in_RDI + 0x38) + 8) = *(long *)(*(long *)(in_RDI + 0x38) + 8) + -1;
    if (*(long *)(*(long *)(in_RDI + 0x38) + 8) == 0) {
      (**(code **)(**(long **)(in_RDI + 0x38) + 0x10))();
    }
    *(undefined8 *)(in_RDI + 0x38) = 0;
  }
  return;
}

Assistant:

void SQClass::Finalize() {
    _attributes.Null();
    _NULL_SQOBJECT_VECTOR(_defaultvalues,_defaultvalues.size());
    _methods.resize(0);
    _NULL_SQOBJECT_VECTOR(_metamethods,MT_LAST);
    __ObjRelease(_members);
    if(_base) {
        __ObjRelease(_base);
    }
}